

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_info_annex_imgui.h
# Opt level: O0

void lumeview::SubsetInfoAnnex_ImGui(SubsetInfoAnnex *sia)

{
  bool bVar1;
  char *fmt;
  real_t *col;
  bool local_33;
  bool local_32;
  byte local_31;
  undefined1 auStack_30 [7];
  bool oldVisible;
  Color oldColor;
  SubsetProperties *prop;
  index_t isub;
  index_t numSubs;
  SubsetInfoAnnex *sia_local;
  
  _isub = sia;
  prop._4_4_ = lume::SubsetInfoAnnex::num_subset_properties(sia);
  if (prop._4_4_ != 0) {
    ImGui::NewLine();
    ImGui::SameLine(60.0,-1.0);
    ImGui::Text("name");
    ImGui::SameLine(160.0,-1.0);
    ImGui::Text("color");
    ImGui::SameLine(210.0,-1.0);
    ImGui::Text("visible");
    ImGui::Separator();
  }
  for (prop._0_4_ = 0; (uint)prop < prop._4_4_; prop._0_4_ = (uint)prop + 1) {
    oldColor.m_data._8_8_ = lume::SubsetInfoAnnex::subset_properties(_isub,(uint)prop);
    _auStack_30 = *(undefined8 *)(((SubsetProperties *)oldColor.m_data._8_8_)->color).m_data;
    oldColor.m_data._0_8_ =
         *(undefined8 *)((((SubsetProperties *)oldColor.m_data._8_8_)->color).m_data + 2);
    local_31 = ((SubsetProperties *)oldColor.m_data._8_8_)->visible & 1;
    ImGui::PushID((void *)oldColor.m_data._8_8_);
    ImGui::AlignTextToFramePadding();
    ImGui::Text("%d:",(ulong)(uint)prop);
    ImGui::SameLine(60.0,-1.0);
    fmt = (char *)std::__cxx11::string::c_str();
    ImGui::Text(fmt);
    ImGui::SameLine(160.0,-1.0);
    col = lume::SubsetInfoAnnex::Color::data_ptr((Color *)(oldColor.m_data._8_8_ + 0x20));
    ImGui::ColorEdit4("",col,0x20);
    ImGui::SameLine(210.0,-1.0);
    ImGui::Checkbox("",(bool *)(oldColor.m_data._8_8_ + 0x30));
    if ((uint)prop + 1 != prop._4_4_) {
      ImGui::Separator();
    }
    ImGui::PopID();
    bVar1 = lume::SubsetInfoAnnex::Color::operator!=
                      ((Color *)(oldColor.m_data._8_8_ + 0x20),(Color *)auStack_30);
    if ((bVar1) || ((*(byte *)(oldColor.m_data._8_8_ + 0x30) & 1) != (local_31 & 1))) {
      local_32 = lume::SubsetInfoAnnex::Color::operator!=
                           ((Color *)(oldColor.m_data._8_8_ + 0x20),(Color *)auStack_30);
      local_33 = (*(byte *)(oldColor.m_data._8_8_ + 0x30) & 1) != (local_31 & 1);
      MessageQueue::
      post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
                ((SubsetInfoAnnex **)&isub,(uint *)&prop,&local_32,&local_33);
    }
  }
  return;
}

Assistant:

inline void SubsetInfoAnnex_ImGui (lume::SubsetInfoAnnex* sia)
{
	using namespace lume;

	const index_t numSubs = sia->num_subset_properties ();

	
	if (numSubs > 0) {
		ImGui::NewLine ();
		ImGui::SameLine (60);
		ImGui::Text ("name");
		ImGui::SameLine (160);
		ImGui::Text ("color");
		ImGui::SameLine (210);
		ImGui::Text ("visible");
		ImGui::Separator();
	}

	for(index_t isub = 0; isub < numSubs; ++isub) {
		SubsetInfoAnnex::SubsetProperties& prop = sia->subset_properties (isub);
		auto oldColor = prop.color;
		bool oldVisible = prop.visible;

		ImGui::PushID(&prop);
		ImGui::AlignTextToFramePadding();
	    ImGui::Text("%d:", isub);
	    ImGui::SameLine(60);
	    ImGui::Text(prop.name.c_str());
		ImGui::SameLine(160);
		ImGui::ColorEdit4("", prop.color.data_ptr(), ImGuiColorEditFlags_NoInputs);
		ImGui::SameLine(210);
		ImGui::Checkbox ("", &prop.visible);

		if (isub + 1 != numSubs)
			ImGui::Separator();

		ImGui::PopID();

		if (prop.color != oldColor || prop.visible != oldVisible) {
			MessageQueue::post <SubsetInfoAnnexMessage> (
					sia,
					isub,
					prop.color != oldColor,
					prop.visible != oldVisible);
		}
	}
}